

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_shared.h
# Opt level: O2

QString * escapeDependencyPath<QString>(QString *__return_storage_ptr__,QString *path)

{
  char16_t cVar1;
  long lVar2;
  int iVar3;
  QChar QVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  uVar7 = (path->d).size;
  iVar3 = (int)uVar7;
  QString::reserve(__return_storage_ptr__,(long)iVar3);
  uVar5 = 0;
  uVar7 = uVar7 & 0xffffffff;
  if (iVar3 < 1) {
    uVar7 = uVar5;
  }
  do {
    if (uVar5 == uVar7) {
      return __return_storage_ptr__;
    }
    cVar1 = (path->d).ptr[uVar5];
    QVar4.ucs = (char16_t)__return_storage_ptr__;
    if ((cVar1 == L'$') || (cVar1 == L'#')) {
      QString::append(QVar4);
    }
    else {
      uVar6 = uVar5;
      if (cVar1 == L' ') {
        do {
          QString::append(QVar4);
          if ((long)uVar6 < 2) break;
          lVar2 = uVar6 - 1;
          uVar6 = uVar6 - 1;
        } while ((path->d).ptr[lVar2] == L'\\');
      }
    }
    QString::append(QVar4);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

StringType escapeDependencyPath(const StringType &path)
{
    using CT = typename CharType<StringType>::type;
    StringType escapedPath;
    int size = path.size();
    escapedPath.reserve(size);
    for (int i = 0; i < size; ++i) {
        if (path[i] == CT('$')) {
            escapedPath.append(CT('$'));
        } else if (path[i] == CT('#')) {
            escapedPath.append(CT('\\'));
        } else if (path[i] == CT(' ')) {
            escapedPath.append(CT('\\'));
            int backwards_it = i - 1;
            while (backwards_it > 0 && path[backwards_it] == CT('\\')) {
                escapedPath.append(CT('\\'));
                --backwards_it;
            }
        }
        escapedPath.append(path[i]);
    }
    return escapedPath;
}